

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprNodeIsConstant(Walker *pWalker,Expr *pExpr)

{
  byte bVar1;
  u8 uVar2;
  int iVar3;
  
  bVar1 = pWalker->eCode;
  if ((bVar1 == 2) && ((pExpr->flags & 1) != 0)) goto switchD_0016ddb2_caseD_a8;
  uVar2 = pExpr->op;
  switch(uVar2) {
  case 0xa1:
    if (3 < bVar1) {
      return 0;
    }
    if ((pExpr->flags & 0x80000) != 0) {
      return 0;
    }
    break;
  case 0xa5:
  case 0xa6:
  case 0xa7:
  case 0xa9:
  case 0xaa:
    goto LAB_0016de10;
  case 0xa8:
  case 0xab:
    break;
  default:
    if (uVar2 != ';') {
      if (uVar2 != 0x94) {
        return 0;
      }
      if (bVar1 != 4) {
        if (bVar1 != 5) {
          return 0;
        }
        pExpr->op = 'r';
        return 0;
      }
      break;
    }
    iVar3 = sqlite3ExprIdToTrueFalse(pExpr);
    if (iVar3 != 0) {
      return 1;
    }
  case 0xa2:
  case 0xa3:
  case 0xa4:
    if (((pExpr->flags & 8) != 0) && (pWalker->eCode != '\x02')) {
LAB_0016de10:
      return 0;
    }
    if ((pWalker->eCode == '\x03') && (pExpr->iTable == (pWalker->u).n)) {
      return 0;
    }
  }
switchD_0016ddb2_caseD_a8:
  pWalker->eCode = '\0';
  return 2;
}

Assistant:

static int exprNodeIsConstant(Walker *pWalker, Expr *pExpr){

  /* If pWalker->eCode is 2 then any term of the expression that comes from
  ** the ON or USING clauses of a left join disqualifies the expression
  ** from being considered constant. */
  if( pWalker->eCode==2 && ExprHasProperty(pExpr, EP_FromJoin) ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }

  switch( pExpr->op ){
    /* Consider functions to be constant if all their arguments are constant
    ** and either pWalker->eCode==4 or 5 or the function has the
    ** SQLITE_FUNC_CONST flag. */
    case TK_FUNCTION:
      if( pWalker->eCode>=4 || ExprHasProperty(pExpr,EP_ConstFunc) ){
        return WRC_Continue;
      }else{
        pWalker->eCode = 0;
        return WRC_Abort;
      }
    case TK_ID:
      /* Convert "true" or "false" in a DEFAULT clause into the
      ** appropriate TK_TRUEFALSE operator */
      if( sqlite3ExprIdToTrueFalse(pExpr) ){
        return WRC_Prune;
      }
      /* Fall thru */
    case TK_COLUMN:
    case TK_AGG_FUNCTION:
    case TK_AGG_COLUMN:
      testcase( pExpr->op==TK_ID );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_AGG_FUNCTION );
      testcase( pExpr->op==TK_AGG_COLUMN );
      if( ExprHasProperty(pExpr, EP_FixedCol) && pWalker->eCode!=2 ){
        return WRC_Continue;
      }
      if( pWalker->eCode==3 && pExpr->iTable==pWalker->u.iCur ){
        return WRC_Continue;
      }
      /* Fall through */
    case TK_IF_NULL_ROW:
    case TK_REGISTER:
      testcase( pExpr->op==TK_REGISTER );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      pWalker->eCode = 0;
      return WRC_Abort;
    case TK_VARIABLE:
      if( pWalker->eCode==5 ){
        /* Silently convert bound parameters that appear inside of CREATE
        ** statements into a NULL when parsing the CREATE statement text out
        ** of the sqlite_master table */
        pExpr->op = TK_NULL;
      }else if( pWalker->eCode==4 ){
        /* A bound parameter in a CREATE statement that originates from
        ** sqlite3_prepare() causes an error */
        pWalker->eCode = 0;
        return WRC_Abort;
      }
      /* Fall through */
    default:
      testcase( pExpr->op==TK_SELECT ); /* sqlite3SelectWalkFail() disallows */
      testcase( pExpr->op==TK_EXISTS ); /* sqlite3SelectWalkFail() disallows */
      return WRC_Continue;
  }
}